

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

void __thiscall
pbrt::SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
          (SubsurfaceMaterial *this,TextureEvalContext *param_2,SampledWavelengths *param_3,
          undefined8 *param_4,size_t param_5)

{
  float fVar1;
  ulong uVar2;
  int c;
  long lVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  ulong in_XMM1_Qb;
  undefined1 auVar18 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  SampledSpectrum SVar20;
  span<const_float> x;
  span<const_float> values;
  SampledSpectrum r;
  SampledSpectrum mfree;
  UniversalTextureEvaluator local_279;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  SampledSpectrum local_268;
  SampledSpectrum local_258;
  uintptr_t local_248;
  Float local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  uintptr_t local_230;
  uintptr_t local_228;
  ulong local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  ulong uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  ulong uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  TabulatedBSSRDF local_98;
  
  local_258.values.values = (array<float,_4>)ZEXT816(0);
  local_268.values.values = (array<float,_4>)ZEXT816(0);
  uVar2 = (this->sigma_a).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if (((uVar2 & 0xffffffffffff) == 0) ||
     (((this->sigma_s).
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits & 0xffffffffffff) == 0)) {
    local_278 = this->scale;
    local_230 = (this->mfp).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_158._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_158._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_150 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_148._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_148._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_140._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_140._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_138 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_130 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_128._0_4_ = param_2->dudy;
    uStack_128._4_4_ = param_2->dvdx;
    uStack_120._0_4_ = param_2->dvdy;
    uStack_120._4_4_ = param_2->faceIndex;
    local_1f8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1f0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1e8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1e0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_150);
    auVar18 = ZEXT856(in_XMM1_Qb);
    fStack_274 = local_278;
    fStack_270 = local_278;
    fStack_26c = local_278;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_279,(SpectrumTextureHandle)&local_230,*param_2,*param_3);
    auVar16._0_8_ = SVar20.values.values._8_8_;
    auVar16._8_56_ = auVar18;
    auVar11._0_8_ = SVar20.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
    auVar8._0_4_ = auVar4._0_4_ * local_278;
    auVar8._4_4_ = auVar4._4_4_ * fStack_274;
    auVar8._8_4_ = auVar4._8_4_ * fStack_270;
    auVar8._12_4_ = auVar4._12_4_ * fStack_26c;
    local_98._0_16_ = vmaxps_avx(auVar8,_DAT_00601010);
    local_248 = (this->reflectance).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_198._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_198._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_190 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_188._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_188._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_180._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_180._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_178 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_170 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_168._0_4_ = param_2->dudy;
    uStack_168._4_4_ = param_2->dvdx;
    uStack_160._0_4_ = param_2->dvdy;
    uStack_160._4_4_ = param_2->faceIndex;
    local_218 = *(undefined8 *)(param_3->lambda).values;
    uStack_210 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_208 = *(undefined8 *)(param_3->pdf).values;
    uStack_200 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_190);
    auVar18 = ZEXT856(auVar18._0_8_);
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_279,(SpectrumTextureHandle)&local_248,*param_2,*param_3);
    auVar17._0_8_ = SVar20.values.values._8_8_;
    auVar17._8_56_ = auVar18;
    auVar12._0_8_ = SVar20.values.values._0_8_;
    auVar12._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar12._0_16_,auVar17._0_16_);
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    uVar2 = vcmpps_avx512vl(auVar4,_DAT_00601010,5);
    lVar3 = 0;
    auVar4 = vminps_avx512vl(auVar19,auVar4);
    local_240 = (Float)((uint)((byte)uVar2 & 1) * auVar4._0_4_);
    iStack_23c = (uint)((byte)(uVar2 >> 1) & 1) * auVar4._4_4_;
    iStack_238 = (uint)((byte)(uVar2 >> 2) & 1) * auVar4._8_4_;
    iStack_234 = (uint)((byte)(uVar2 >> 3) & 1) * auVar4._12_4_;
    do {
      x.n = (size_t)(this->table).rhoEff.ptr;
      x.ptr = (float *)(this->table).rhoSamples.nStored;
      values.n = param_5;
      values.ptr = (float *)(this->table).rhoEff.nStored;
      FVar5 = InvertCatmullRom((pbrt *)(this->table).rhoSamples.ptr,x,values,(&local_240)[lVar3]);
      fVar1 = (&(((TabulatedBSSRDF *)(&local_98.sigma_t + -5))->po).
                super_Tuple3<pbrt::Point3,_float>.x)[lVar3];
      local_268.values.values[lVar3] = FVar5 / fVar1;
      local_258.values.values[lVar3] = (1.0 - FVar5) / fVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  else {
    local_278 = this->scale;
    local_d8._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_d8._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_d0 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_c8._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_c8._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_c0._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_c0._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_b8 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_b0 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_a8._0_4_ = param_2->dudy;
    uStack_a8._4_4_ = param_2->dvdx;
    uStack_a0._0_4_ = param_2->dvdy;
    uStack_a0._4_4_ = param_2->faceIndex;
    local_1b8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1b0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1a8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1a0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_d0);
    auVar18 = ZEXT856(in_XMM1_Qb);
    fStack_274 = local_278;
    fStack_270 = local_278;
    fStack_26c = local_278;
    local_220 = uVar2;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_279,(SpectrumTextureHandle)&local_220,*param_2,*param_3);
    auVar14._0_8_ = SVar20.values.values._8_8_;
    auVar14._8_56_ = auVar18;
    auVar9._0_8_ = SVar20.values.values._0_8_;
    auVar9._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
    auVar6._0_4_ = auVar4._0_4_ * local_278;
    auVar6._4_4_ = auVar4._4_4_ * fStack_274;
    auVar6._8_4_ = auVar4._8_4_ * fStack_270;
    auVar6._12_4_ = auVar4._12_4_ * fStack_26c;
    local_258.values.values = (array<float,_4>)vmaxps_avx(auVar6,ZEXT816(0) << 0x40);
    local_278 = this->scale;
    local_228 = (this->sigma_s).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_118._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_118._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_110 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_108._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_108._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_100._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_100._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_f8 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_f0 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_e8._0_4_ = param_2->dudy;
    uStack_e8._4_4_ = param_2->dvdx;
    uStack_e0._0_4_ = param_2->dvdy;
    uStack_e0._4_4_ = param_2->faceIndex;
    local_1d8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1d0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1c8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1c0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_110);
    auVar18 = ZEXT856(0);
    fStack_274 = local_278;
    fStack_270 = local_278;
    fStack_26c = local_278;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_279,(SpectrumTextureHandle)&local_228,*param_2,*param_3);
    auVar15._0_8_ = SVar20.values.values._8_8_;
    auVar15._8_56_ = auVar18;
    auVar10._0_8_ = SVar20.values.values._0_8_;
    auVar10._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
    auVar7._0_4_ = auVar4._0_4_ * local_278;
    auVar7._4_4_ = auVar4._4_4_ * fStack_274;
    auVar7._8_4_ = auVar4._8_4_ * fStack_270;
    auVar7._12_4_ = auVar4._12_4_ * fStack_26c;
    local_268.values.values = (array<float,_4>)vmaxps_avx(auVar7,_DAT_00601010);
  }
  TabulatedBSSRDF::TabulatedBSSRDF
            (&local_98,&param_2->p,(Vector3f *)&param_2[1].uv,(Normal3f *)&param_2[1].dpdy,
             (Vector3f *)(param_2 + 1),0.0,this->eta,&local_258,&local_268,&this->table);
  param_4[6] = local_98._48_8_;
  param_4[7] = local_98.ts.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  param_4[8] = local_98._64_8_;
  param_4[9] = local_98.table;
  param_4[10] = local_98.sigma_t.values.values._0_8_;
  param_4[0xb] = local_98.sigma_t.values.values._8_8_;
  param_4[0xc] = local_98.rho.values.values._0_8_;
  param_4[0xd] = local_98.rho.values.values._8_8_;
  *param_4 = local_98.po.super_Tuple3<pbrt::Point3,_float>._0_8_;
  param_4[1] = local_98._8_8_;
  param_4[2] = local_98.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  param_4[3] = local_98._24_8_;
  param_4[4] = local_98.ns.super_Tuple3<pbrt::Normal3,_float>._4_8_;
  param_4[5] = local_98.ss.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  param_4[6] = local_98._48_8_;
  param_4[7] = local_98.ts.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  return;
}

Assistant:

PBRT_CPU_GPU void GetBSSRDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                                SampledWavelengths &lambda,
                                TabulatedBSSRDF *bssrdf) const {
        SampledSpectrum sig_a, sig_s;
        if (sigma_a && sigma_s) {
            // Evaluate textures for $\sigma_\roman{a}$ and $\sigma_\roman{s}$
            sig_a = ClampZero(scale * texEval(sigma_a, ctx, lambda));
            sig_s = ClampZero(scale * texEval(sigma_s, ctx, lambda));

        } else {
            // Compute _sig_a_ and _sig_s_ from reflectance and mfp
            DCHECK(reflectance && mfp);
            SampledSpectrum mfree = ClampZero(scale * texEval(mfp, ctx, lambda));
            SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
            SubsurfaceFromDiffuse(table, r, mfree, &sig_a, &sig_s);
        }
        *bssrdf = TabulatedBSSRDF(ctx.p, ctx.dpdus, ctx.ns, ctx.wo, 0 /* FIXME: si.time*/,
                                  eta, sig_a, sig_s, &table);
    }